

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenArraySet(BinaryenModuleRef module,BinaryenExpressionRef ref,BinaryenExpressionRef index,
                BinaryenExpressionRef value)

{
  ArraySet *this;
  
  this = (ArraySet *)MixedArena::allocSpace(&module->allocator,0x28,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)75>).super_Expression._id = ArraySetId;
  (this->super_SpecificExpression<(wasm::Expression::Id)75>).super_Expression.type.id = 0;
  this->ref = ref;
  this->index = index;
  this->value = value;
  wasm::ArraySet::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenArraySet(BinaryenModuleRef module,
                                       BinaryenExpressionRef ref,
                                       BinaryenExpressionRef index,
                                       BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeArraySet((Expression*)ref, (Expression*)index, (Expression*)value));
}